

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2,int e3,
          int e4,int e5,int e6)

{
  undefined4 in_register_00000084;
  undefined4 in_stack_00000028;
  _Function_base _Stack_68;
  undefined1 local_48 [16];
  disp *local_38;
  
  local_38 = (disp *)CONCAT44(in_register_00000084,e1);
  local_48._0_8_ = member;
  local_48._8_8_ = object;
  std::
  function<void(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)>
  ::function<cppcms::url_dispatcher::binder6<disp>,void>
            ((function<void(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)>
              *)&_Stack_68,(binder6<disp> *)local_48);
  cppcms::url_dispatcher::assign(this,regex,&_Stack_68,e2,e3,e4,e5,e6,in_stack_00000028);
  std::_Function_base::~_Function_base(&_Stack_68);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string,std::string,std::string,std::string,std::string),C *object,int e1,int e2,int e3,int e4,int e5,int e6)
		{
			assign(regex,binder6<C>(member,object),e1,e2,e3,e4,e5,e6);
		}